

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiInputTextState::ImGuiInputTextState(ImGuiInputTextState *this)

{
  ImGuiInputTextState *this_local;
  
  ImVector<unsigned_int>::ImVector(&this->TextW);
  ImVector<char>::ImVector(&this->TextA);
  ImVector<char>::ImVector(&this->InitialTextA);
  memset(this,0,0x1660);
  return;
}

Assistant:

ImGuiInputTextState()                   { memset(this, 0, sizeof(*this)); }